

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateMessageSerializationMethods
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FieldDescriptor **ppFVar4;
  MessageOptions *pMVar5;
  size_type sVar6;
  reference ppEVar7;
  ImmutableFieldLiteGenerator *pIVar8;
  long lVar9;
  int local_bc;
  int local_b8;
  int i_2;
  int j;
  int i_1;
  string local_90;
  ExtensionRange **local_68;
  ExtensionRange **local_60;
  ExtensionRange *local_58 [3];
  int local_3c;
  undefined1 local_38 [4];
  int i;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  ppFVar4 = SortFieldsByNumber((this->super_MessageGenerator).descriptor_);
  internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::scoped_array
            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
             &sorted_extensions.
              super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,ppFVar4);
  std::
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  ::vector((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
            *)local_38);
  for (local_3c = 0; iVar3 = local_3c,
      iVar2 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_),
      iVar3 < iVar2; local_3c = local_3c + 1) {
    local_58[0] = Descriptor::extension_range((this->super_MessageGenerator).descriptor_,local_3c);
    std::
    vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ::push_back((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 *)local_38,local_58);
  }
  local_60 = (ExtensionRange **)
             std::
             vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
             ::begin((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                      *)local_38);
  local_68 = (ExtensionRange **)
             std::
             vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
             ::end((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                    *)local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,google::protobuf::compiler::java::ExtensionRangeOrdering>
            (local_60,local_68);
  io::Printer::Print(printer,
                     "public void writeTo(com.google.protobuf.CodedOutputStream output)\n                    throws java.io.IOException {\n"
                    );
  io::Printer::Indent(printer);
  bVar1 = HasPackedFields((this->super_MessageGenerator).descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,"getSerializedSize();\n");
  }
  iVar3 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  if (0 < iVar3) {
    pMVar5 = Descriptor::options((this->super_MessageGenerator).descriptor_);
    bVar1 = MessageOptions::message_set_wire_format(pMVar5);
    if (bVar1) {
      ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                (&local_90,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
      io::Printer::Print(printer,
                         "com.google.protobuf.GeneratedMessageLite\n  .ExtendableMessage<$classname$, $classname$.Builder>\n    .ExtensionWriter extensionWriter =\n      newMessageSetExtensionWriter();\n"
                         ,"classname",&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    else {
      ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                ((string *)&j,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
      io::Printer::Print(printer,
                         "com.google.protobuf.GeneratedMessageLite\n  .ExtendableMessage<$classname$, $classname$.Builder>\n    .ExtensionWriter extensionWriter =\n      newExtensionWriter();\n"
                         ,"classname",(string *)&j);
      std::__cxx11::string::~string((string *)&j);
    }
  }
  i_2 = 0;
  local_b8 = 0;
  while( true ) {
    iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    bVar1 = true;
    if (iVar3 <= i_2) {
      sVar6 = std::
              vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ::size((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                      *)local_38);
      bVar1 = (ulong)(long)local_b8 < sVar6;
    }
    if (!bVar1) break;
    iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    if (i_2 == iVar3) {
      sVar6 = (size_type)local_b8;
      local_b8 = local_b8 + 1;
      ppEVar7 = std::
                vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                ::operator[]((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                              *)local_38,sVar6);
      GenerateSerializeOneExtensionRange(this,printer,*ppEVar7);
    }
    else {
      sVar6 = std::
              vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ::size((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                      *)local_38);
      if ((long)local_b8 == sVar6) {
        lVar9 = (long)i_2;
        i_2 = i_2 + 1;
        ppFVar4 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
                             &sorted_extensions.
                              super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,lVar9);
        GenerateSerializeOneField(this,printer,*ppFVar4);
      }
      else {
        ppFVar4 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
                             &sorted_extensions.
                              super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)i_2);
        iVar3 = FieldDescriptor::number(*ppFVar4);
        ppEVar7 = std::
                  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                  ::operator[]((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                *)local_38,(long)local_b8);
        if (iVar3 < (*ppEVar7)->start) {
          lVar9 = (long)i_2;
          i_2 = i_2 + 1;
          ppFVar4 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                              ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
                               &sorted_extensions.
                                super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,lVar9);
          GenerateSerializeOneField(this,printer,*ppFVar4);
        }
        else {
          sVar6 = (size_type)local_b8;
          local_b8 = local_b8 + 1;
          ppEVar7 = std::
                    vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                    ::operator[]((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                  *)local_38,sVar6);
          GenerateSerializeOneExtensionRange(this,printer,*ppEVar7);
        }
      }
    }
  }
  bVar1 = PreserveUnknownFields((this->super_MessageGenerator).descriptor_);
  if (bVar1) {
    pMVar5 = Descriptor::options((this->super_MessageGenerator).descriptor_);
    bVar1 = MessageOptions::message_set_wire_format(pMVar5);
    if (bVar1) {
      io::Printer::Print(printer,"unknownFields.writeAsMessageSetTo(output);\n");
    }
    else {
      io::Printer::Print(printer,"unknownFields.writeTo(output);\n");
    }
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,
                     "}\n\npublic int getSerializedSize() {\n  int size = memoizedSerializedSize;\n  if (size != -1) return size;\n\n  size = 0;\n"
                    );
  io::Printer::Indent(printer);
  for (local_bc = 0; iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_),
      local_bc < iVar3; local_bc = local_bc + 1) {
    ppFVar4 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                        ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
                         &sorted_extensions.
                          super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_bc);
    pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (&this->field_generators_,*ppFVar4);
    (*pIVar8->_vptr_ImmutableFieldLiteGenerator[0xe])(pIVar8,printer);
  }
  iVar3 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  if (0 < iVar3) {
    pMVar5 = Descriptor::options((this->super_MessageGenerator).descriptor_);
    bVar1 = MessageOptions::message_set_wire_format(pMVar5);
    if (bVar1) {
      io::Printer::Print(printer,"size += extensionsSerializedSizeAsMessageSet();\n");
    }
    else {
      io::Printer::Print(printer,"size += extensionsSerializedSize();\n");
    }
  }
  bVar1 = PreserveUnknownFields((this->super_MessageGenerator).descriptor_);
  if (bVar1) {
    pMVar5 = Descriptor::options((this->super_MessageGenerator).descriptor_);
    bVar1 = MessageOptions::message_set_wire_format(pMVar5);
    if (bVar1) {
      io::Printer::Print(printer,"size += unknownFields.getSerializedSizeAsMessageSet();\n");
    }
    else {
      io::Printer::Print(printer,"size += unknownFields.getSerializedSize();\n");
    }
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  memoizedSerializedSize = size;\n  return size;\n}\n\n");
  std::
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  ::~vector((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
             *)local_38);
  internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array
            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
             &sorted_extensions.
              super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::
GenerateMessageSerializationMethods(io::Printer* printer) {
  google::protobuf::scoped_array<const FieldDescriptor * > sorted_fields(
      SortFieldsByNumber(descriptor_));

  std::vector<const Descriptor::ExtensionRange*> sorted_extensions;
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  std::sort(sorted_extensions.begin(), sorted_extensions.end(),
            ExtensionRangeOrdering());

  printer->Print(
    "public void writeTo(com.google.protobuf.CodedOutputStream output)\n"
    "                    throws java.io.IOException {\n");
  printer->Indent();
  if (HasPackedFields(descriptor_)) {
    // writeTo(CodedOutputStream output) might be invoked without
    // getSerializedSize() ever being called, but we need the memoized
    // sizes in case this message has packed fields. Rather than emit checks for
    // each packed field, just call getSerializedSize() up front.
    // In most cases, getSerializedSize() will have already been called anyway
    // by one of the wrapper writeTo() methods, making this call cheap.
    printer->Print(
      "getSerializedSize();\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "com.google.protobuf.GeneratedMessageLite\n"
        "  .ExtendableMessage<$classname$, $classname$.Builder>\n"
        "    .ExtensionWriter extensionWriter =\n"
        "      newMessageSetExtensionWriter();\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_));
    } else {
      printer->Print(
        "com.google.protobuf.GeneratedMessageLite\n"
        "  .ExtendableMessage<$classname$, $classname$.Builder>\n"
        "    .ExtensionWriter extensionWriter =\n"
        "      newExtensionWriter();\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_));
    }
  }

  // Merge the fields and the extension ranges, both sorted by field number.
  for (int i = 0, j = 0;
       i < descriptor_->field_count() || j < sorted_extensions.size();
       ) {
    if (i == descriptor_->field_count()) {
      GenerateSerializeOneExtensionRange(printer, sorted_extensions[j++]);
    } else if (j == sorted_extensions.size()) {
      GenerateSerializeOneField(printer, sorted_fields[i++]);
    } else if (sorted_fields[i]->number() < sorted_extensions[j]->start) {
      GenerateSerializeOneField(printer, sorted_fields[i++]);
    } else {
      GenerateSerializeOneExtensionRange(printer, sorted_extensions[j++]);
    }
  }

  if (PreserveUnknownFields(descriptor_)) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "unknownFields.writeAsMessageSetTo(output);\n");
    } else {
      printer->Print(
        "unknownFields.writeTo(output);\n");
    }
  }

  printer->Outdent();
  printer->Print(
    "}\n"
    "\n"
    "public int getSerializedSize() {\n"
    "  int size = memoizedSerializedSize;\n"
    "  if (size != -1) return size;\n"
    "\n"
    "  size = 0;\n");
  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(sorted_fields[i]).GenerateSerializedSizeCode(printer);
  }

  if (descriptor_->extension_range_count() > 0) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "size += extensionsSerializedSizeAsMessageSet();\n");
    } else {
      printer->Print(
        "size += extensionsSerializedSize();\n");
    }
  }

  if (PreserveUnknownFields(descriptor_)) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "size += unknownFields.getSerializedSizeAsMessageSet();\n");
    } else {
      printer->Print(
        "size += unknownFields.getSerializedSize();\n");
    }
  }

  printer->Outdent();
  printer->Print(
    "  memoizedSerializedSize = size;\n"
    "  return size;\n"
    "}\n"
    "\n");
}